

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

void ZSTD_CCtxParams_init_internal
               (ZSTD_CCtx_params *cctxParams,ZSTD_parameters *params,int compressionLevel)

{
  undefined4 uVar1;
  ZSTD_compressionParameters cParams;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  uint uVar7;
  ZSTD_paramSwitch_e ZVar8;
  int iVar9;
  size_t sVar10;
  undefined4 in_stack_ffffffffffffffc4;
  int compressionLevel_local;
  ZSTD_parameters *params_local;
  ZSTD_CCtx_params *cctxParams_local;
  
  uVar1 = (params->cParams).windowLog;
  uVar2 = (params->cParams).hashLog;
  uVar3 = (params->cParams).searchLog;
  uVar4 = (params->cParams).minMatch;
  uVar5 = (params->cParams).targetLength;
  uVar6 = (params->cParams).strategy;
  cParams.minMatch = uVar6;
  cParams.searchLog = uVar5;
  cParams.hashLog = uVar4;
  cParams.chainLog = uVar3;
  cParams.windowLog = uVar2;
  cParams.targetLength = in_stack_ffffffffffffffc4;
  cParams.strategy = uVar1;
  sVar10 = ZSTD_checkCParams(cParams);
  if (sVar10 == 0) {
    memset(cctxParams,0,0xd0);
    uVar7 = (params->cParams).chainLog;
    (cctxParams->cParams).windowLog = (params->cParams).windowLog;
    (cctxParams->cParams).chainLog = uVar7;
    uVar7 = (params->cParams).searchLog;
    (cctxParams->cParams).hashLog = (params->cParams).hashLog;
    (cctxParams->cParams).searchLog = uVar7;
    uVar7 = (params->cParams).targetLength;
    (cctxParams->cParams).minMatch = (params->cParams).minMatch;
    (cctxParams->cParams).targetLength = uVar7;
    (cctxParams->cParams).strategy = (params->cParams).strategy;
    iVar9 = (params->fParams).checksumFlag;
    (cctxParams->fParams).contentSizeFlag = (params->fParams).contentSizeFlag;
    (cctxParams->fParams).checksumFlag = iVar9;
    (cctxParams->fParams).noDictIDFlag = (params->fParams).noDictIDFlag;
    cctxParams->compressionLevel = compressionLevel;
    ZVar8 = ZSTD_resolveRowMatchFinderMode(cctxParams->useRowMatchFinder,&params->cParams);
    cctxParams->useRowMatchFinder = ZVar8;
    ZVar8 = ZSTD_resolveBlockSplitterMode(cctxParams->useBlockSplitter,&params->cParams);
    cctxParams->useBlockSplitter = ZVar8;
    ZVar8 = ZSTD_resolveEnableLdm((cctxParams->ldmParams).enableLdm,&params->cParams);
    (cctxParams->ldmParams).enableLdm = ZVar8;
    iVar9 = ZSTD_resolveExternalSequenceValidation(cctxParams->validateSequences);
    cctxParams->validateSequences = iVar9;
    sVar10 = ZSTD_resolveMaxBlockSize(cctxParams->maxBlockSize);
    cctxParams->maxBlockSize = sVar10;
    ZVar8 = ZSTD_resolveExternalRepcodeSearch
                      (cctxParams->searchForExternalRepcodes,compressionLevel);
    cctxParams->searchForExternalRepcodes = ZVar8;
    return;
  }
  __assert_fail("!ZSTD_checkCParams(params->cParams)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                ,0x17f,
                "void ZSTD_CCtxParams_init_internal(ZSTD_CCtx_params *, const ZSTD_parameters *, int)"
               );
}

Assistant:

static void
ZSTD_CCtxParams_init_internal(ZSTD_CCtx_params* cctxParams,
                        const ZSTD_parameters* params,
                              int compressionLevel)
{
    assert(!ZSTD_checkCParams(params->cParams));
    ZSTD_memset(cctxParams, 0, sizeof(*cctxParams));
    cctxParams->cParams = params->cParams;
    cctxParams->fParams = params->fParams;
    /* Should not matter, as all cParams are presumed properly defined.
     * But, set it for tracing anyway.
     */
    cctxParams->compressionLevel = compressionLevel;
    cctxParams->useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(cctxParams->useRowMatchFinder, &params->cParams);
    cctxParams->useBlockSplitter = ZSTD_resolveBlockSplitterMode(cctxParams->useBlockSplitter, &params->cParams);
    cctxParams->ldmParams.enableLdm = ZSTD_resolveEnableLdm(cctxParams->ldmParams.enableLdm, &params->cParams);
    cctxParams->validateSequences = ZSTD_resolveExternalSequenceValidation(cctxParams->validateSequences);
    cctxParams->maxBlockSize = ZSTD_resolveMaxBlockSize(cctxParams->maxBlockSize);
    cctxParams->searchForExternalRepcodes = ZSTD_resolveExternalRepcodeSearch(cctxParams->searchForExternalRepcodes, compressionLevel);
    DEBUGLOG(4, "ZSTD_CCtxParams_init_internal: useRowMatchFinder=%d, useBlockSplitter=%d ldm=%d",
                cctxParams->useRowMatchFinder, cctxParams->useBlockSplitter, cctxParams->ldmParams.enableLdm);
}